

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int ed_getvariant(disisa *isa,char *name)

{
  int iVar1;
  char *in_RSI;
  long in_RDI;
  int i;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    if (*(int *)(in_RDI + 0x20) <= local_1c) {
      return 0;
    }
    iVar1 = strcmp(in_RSI,*(char **)(*(long *)(in_RDI + 0x18) + (long)local_1c * 0x10));
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  return *(int *)(*(long *)(in_RDI + 0x18) + (long)local_1c * 0x10 + 8);
}

Assistant:

int ed_getvariant(const struct disisa *isa, const char *name) {
	int i;
	for (i = 0; i < isa->varsnum; i++)
		if (!strcmp(name, isa->vars[i].name))
			return isa->vars[i].vartype;
	return 0;
}